

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O1

int tc_hmac_prng_generate(uint8_t *out,uint outlen,TCHmacPrng_t prng)

{
  int iVar1;
  EVP_PKEY_CTX *src;
  bool bVar2;
  bool bVar3;
  
  iVar1 = 0;
  if (((0xfff7ffff < outlen - 0x80001) && (iVar1 = 0, out != (uint8_t *)0x0)) &&
     (iVar1 = 0, prng != (TCHmacPrng_t)0x0)) {
    if (prng->countdown == 0) {
      iVar1 = -1;
    }
    else {
      prng->countdown = prng->countdown - 1;
      if (outlen != 0) {
        do {
          tc_hmac_init(&prng->h);
          tc_hmac_update(&prng->h,prng->v,0x20);
          tc_hmac_final(prng->v,0x20,&prng->h);
          src = (EVP_PKEY_CTX *)0x20;
          if (outlen < 0x20) {
            src = (EVP_PKEY_CTX *)(ulong)outlen;
          }
          _copy((EVP_PKEY_CTX *)out,src);
          out = (uint8_t *)((EVP_PKEY_CTX *)out + (long)src);
          bVar2 = 0x1f < outlen;
          outlen = outlen - 0x20;
          bVar3 = outlen != 0;
          if (!bVar2) {
            outlen = 0;
          }
        } while (bVar2 && bVar3);
      }
      update(prng,prng->v,0x20);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int tc_hmac_prng_generate(uint8_t *out, unsigned int outlen, TCHmacPrng_t prng)
{
	unsigned int bufferlen;

	/* input sanity check: */
	if (out == (uint8_t *) 0 ||
	    prng == (TCHmacPrng_t) 0 ||
	    outlen == 0 ||
	    outlen > MAX_OUT) {
		return TC_CRYPTO_FAIL;
	} else if (prng->countdown == 0) {
		return TC_HMAC_PRNG_RESEED_REQ;
	}

	prng->countdown--;

	while (outlen != 0) {
		/* operate HMAC in OFB mode to create "random" outputs */
		(void)tc_hmac_init(&prng->h);
		(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
		(void)tc_hmac_final(prng->v, sizeof(prng->v), &prng->h);

		bufferlen = (TC_SHA256_DIGEST_SIZE > outlen) ?
			outlen : TC_SHA256_DIGEST_SIZE;
		(void)_copy(out, bufferlen, prng->v, bufferlen);

		out += bufferlen;
		outlen = (outlen > TC_SHA256_DIGEST_SIZE) ?
			(outlen - TC_SHA256_DIGEST_SIZE) : 0;
	}

	/* block future PRNG compromises from revealing past state */
	update(prng, prng->v, TC_SHA256_DIGEST_SIZE);

	return TC_CRYPTO_SUCCESS;
}